

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMacroCommand.cxx
# Opt level: O2

void __thiscall cmMacroHelperCommand::~cmMacroHelperCommand(cmMacroHelperCommand *this)

{
  (this->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmMacroHelperCommand_00647bd8;
  std::__cxx11::string::~string((string *)&this->FilePath);
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector(&this->Functions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->Args);
  cmCommand::~cmCommand(&this->super_cmCommand);
  return;
}

Assistant:

~cmMacroHelperCommand() CM_OVERRIDE {}